

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall VulkanHppGenerator::checkCorrectness(VulkanHppGenerator *this)

{
  size_type sVar1;
  allocator<char> local_39;
  string local_38;
  
  sVar1 = (this->m_vulkanLicenseHeader)._M_string_length;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"missing license header",&local_39);
  checkForError(sVar1 != 0,-1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  checkBitmaskCorrectness(this);
  checkCommandCorrectness(this);
  checkDefineCorrectness(this);
  checkEnumCorrectness(this);
  checkExtensionCorrectness(this);
  checkFuncPointerCorrectness(this);
  checkHandleCorrectness(this);
  checkRequireCorrectness(this);
  checkSpirVCapabilityCorrectness(this);
  checkStructCorrectness(this);
  checkSyncAccessCorrectness(this);
  checkSyncStageCorrectness(this);
  return;
}

Assistant:

void VulkanHppGenerator::checkCorrectness() const
{
  checkForError( !m_vulkanLicenseHeader.empty(), -1, "missing license header" );
  checkBitmaskCorrectness();
  checkCommandCorrectness();
  checkDefineCorrectness();
  checkEnumCorrectness();
  checkExtensionCorrectness();
  checkFuncPointerCorrectness();
  checkHandleCorrectness();
  checkRequireCorrectness();
  checkSpirVCapabilityCorrectness();
  checkStructCorrectness();
  checkSyncAccessCorrectness();
  checkSyncStageCorrectness();
}